

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stl_type_index.hpp
# Opt level: O0

stl_type_index
boost::typeindex::stl_type_index::
type_id<boost::_bi::bind_t<void,boost::_mfi::mf0<void,boost::unit_test::test_unit_fixture>,boost::_bi::list1<boost::_bi::value<boost::shared_ptr<boost::unit_test::test_unit_fixture>>>>>
          (void)

{
  type_info_t *in_RAX;
  stl_type_index local_8;
  
  local_8.data_ = in_RAX;
  stl_type_index(&local_8,(type_info_t *)
                          &_bi::
                           bind_t<void,boost::_mfi::mf0<void,boost::unit_test::test_unit_fixture>,boost::_bi::list1<boost::_bi::value<boost::shared_ptr<boost::unit_test::test_unit_fixture>>>>
                           ::typeinfo);
  return (stl_type_index)local_8.data_;
}

Assistant:

inline stl_type_index stl_type_index::type_id() BOOST_NOEXCEPT {
    typedef BOOST_DEDUCED_TYPENAME boost::remove_reference<T>::type no_ref_t;
    typedef BOOST_DEDUCED_TYPENAME boost::remove_cv<no_ref_t>::type no_cvr_prefinal_t;

    #  if (defined(__EDG_VERSION__) && __EDG_VERSION__ < 245) \
        || (defined(__sgi) && defined(_COMPILER_VERSION) && _COMPILER_VERSION <= 744)

        // Old EDG-based compilers seem to mistakenly distinguish 'integral' from 'signed integral'
        // in typeid() expressions. Full template specialization for 'integral' fixes that issue:
        typedef BOOST_DEDUCED_TYPENAME boost::mpl::if_<
            boost::is_signed<no_cvr_prefinal_t>,
            boost::make_signed<no_cvr_prefinal_t>,
            boost::mpl::identity<no_cvr_prefinal_t>
        >::type no_cvr_prefinal_lazy_t;

        typedef BOOST_DEDUCED_TYPENAME no_cvr_prefinal_t::type no_cvr_t;
    #else
        typedef no_cvr_prefinal_t no_cvr_t;
    #endif

    return typeid(no_cvr_t);
}